

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O2

size_t coll_seq_remove_all(coll_seq_t *seq,void *data)

{
  coll_seq_node_t *__ptr;
  coll_seq_node_t *pcVar1;
  coll_seq_t *pcVar2;
  size_t sVar3;
  bool bVar4;
  
  pcVar1 = seq->head;
  __ptr = (coll_seq_node_t *)0x0;
  sVar3 = 0;
  do {
    pcVar2 = (coll_seq_t *)&__ptr->next;
    bVar4 = __ptr == (coll_seq_node_t *)0x0;
    __ptr = pcVar1;
    if (bVar4) {
      pcVar2 = seq;
    }
    while( true ) {
      if (__ptr == (coll_seq_node_t *)0x0) {
        return sVar3;
      }
      pcVar1 = __ptr->next;
      if (__ptr->data != data) break;
      pcVar2->head = pcVar1;
      free(__ptr);
      seq->len = seq->len - 1;
      sVar3 = sVar3 + 1;
      __ptr = pcVar1;
    }
  } while( true );
}

Assistant:

size_t coll_seq_remove_all(coll_seq_t *seq, void *data) {
    size_t count = 0;
    node_t *prev = NULL, *cur = seq->head;
    while (cur) {
        node_t *next = cur->next;
        if (cur->data == data) {
            if (!prev) {
                seq->head = next;
            } else {
                prev->next = next;
            }
            free(cur);
            --(seq->len);
            ++count;
        } else {
            prev = cur;
        }
        cur = next;
    }
    return count;
}